

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  ulong *puVar1;
  int *piVar2;
  uint8_t *puVar3;
  LZ4_stream_t_internal *__src;
  char cVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  BYTE *d;
  ulong *puVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int *piVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  BYTE *e;
  ulong uVar20;
  U32 *pUVar21;
  int *piVar22;
  ulong *puVar23;
  ulong *puVar24;
  long lVar25;
  long lVar26;
  ulong *puVar27;
  ulong *puVar28;
  long lVar29;
  char *pcVar30;
  ulong *puVar31;
  uint uVar32;
  BYTE *e_3;
  long *plVar33;
  int iVar34;
  int *piVar35;
  int *piVar36;
  int iVar37;
  ulong *puVar38;
  char *pcVar39;
  BYTE *s;
  int local_d0;
  U32 *local_c8;
  U32 *hashTable;
  char *local_b8;
  U32 *hashTable_16;
  int local_88;
  int local_80;
  
  if ((LZ4_stream->internal_donotuse).dirty != 0) {
    return 0;
  }
  uVar19 = (LZ4_stream->internal_donotuse).dictSize;
  puVar3 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  if (acceleration < 2) {
    acceleration = 1;
  }
  uVar20 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (puVar3 + uVar19 == (uint8_t *)source ||
      (LZ4_stream->internal_donotuse).dictSize - 4 < 0xfffffffd) {
    piVar22 = (int *)(LZ4_stream->internal_donotuse).dictionary;
    piVar16 = (int *)(puVar3 + uVar19);
  }
  else {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
    uVar20 = 0;
    piVar22 = (int *)source;
    piVar16 = (int *)source;
  }
  piVar2 = (int *)(source + inputSize);
  if ((piVar22 < piVar2) && (piVar2 < piVar16)) {
    local_80 = (int)piVar2;
    uVar11 = (int)piVar16 - local_80;
    uVar19 = 0x10000;
    if (uVar11 < 0x10000) {
      uVar19 = uVar11;
    }
    uVar20 = 0;
    if (3 < uVar11) {
      uVar20 = (ulong)uVar19;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar20;
    piVar22 = (int *)((long)piVar16 - uVar20);
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)piVar22;
  }
  uVar19 = (uint)uVar20;
  local_88 = (int)dest;
  if (piVar16 == (int *)source) {
    uVar11 = (LZ4_stream->internal_donotuse).currentOffset;
    lVar25 = (long)source - (ulong)uVar11;
    iVar6 = (int)lVar25;
    if (uVar11 <= uVar19 || 0xffff < uVar19) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      pcVar30 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar19 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar11 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if ((uint)inputSize < 0xd) {
LAB_00110b63:
        uVar20 = (long)piVar2 - (long)source;
        if (pcVar30 < dest + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
          return 0;
        }
        if (uVar20 < 0xf) {
          *dest = (char)uVar20 << 4;
        }
        else {
          *dest = -0x10;
          for (uVar13 = uVar20 - 0xf; dest = dest + 1, 0xfe < uVar13; uVar13 = uVar13 - 0xff) {
            *dest = -1;
          }
          *dest = (char)uVar13;
        }
        memcpy(dest + 1,source,uVar20);
        return ((int)(dest + 1) + (int)uVar20) - local_88;
      }
      piVar22 = (int *)(source + -uVar20);
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar11;
LAB_00110736:
      iVar7 = 1;
      lVar26 = *(long *)((long)source + 1);
      plVar10 = (long *)((long)source + 1);
      iVar12 = acceleration << 6;
      while( true ) {
        plVar9 = (long *)((long)iVar7 + (long)plVar10);
        if ((long *)((long)piVar2 - 0xbU) < plVar9) goto LAB_00110b63;
        uVar20 = (ulong)(lVar26 * -0x30e4432345000000) >> 0x34;
        uVar19 = *(uint *)((long)LZ4_stream + uVar20 * 4);
        iVar7 = (int)plVar10;
        lVar26 = *plVar9;
        *(int *)((long)LZ4_stream + uVar20 * 4) = iVar7 - iVar6;
        if (((uint)(iVar7 - iVar6) <= uVar19 + 0xffff) &&
           (*(int *)(lVar25 + (ulong)uVar19) == (int)*plVar10)) break;
        iVar7 = iVar12 >> 6;
        iVar12 = iVar12 + 1;
        plVar10 = plVar9;
      }
      lVar14 = (ulong)uVar19 + lVar25;
      lVar26 = 0;
      cVar4 = (char)plVar10 * '\x10' + (char)source * -0x10;
      do {
        cVar5 = cVar4;
        lVar17 = lVar26;
        piVar16 = (int *)(lVar14 + lVar17);
        plVar9 = (long *)((long)plVar10 + lVar17);
        if ((piVar16 <= piVar22) || (plVar9 <= source)) break;
        lVar26 = lVar17 + -1;
        cVar4 = cVar5 + -0x10;
      } while (*(char *)((long)plVar10 + lVar17 + -1) == *(char *)(lVar14 + -1 + lVar17));
      local_d0 = (int)source;
      uVar13 = (ulong)(uint)((iVar7 - local_d0) + (int)lVar17);
      uVar20 = (ulong)(uint)(iVar7 - local_d0) + lVar17;
      if (pcVar30 < dest + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9) {
        return 0;
      }
      if ((uint)uVar20 < 0xf) {
        plVar10 = (long *)(dest + 1);
        *dest = cVar5;
      }
      else {
        *dest = -0x10;
        plVar10 = (long *)(dest + 2);
        for (iVar12 = (iVar7 - local_d0) + (int)lVar17 + -0xf; 0xfe < iVar12;
            iVar12 = iVar12 + -0xff) {
          *(char *)((long)plVar10 + -1) = -1;
          plVar10 = (long *)((long)plVar10 + 1);
        }
        *(char *)((long)plVar10 + -1) = (char)iVar12;
      }
      plVar33 = (long *)(uVar13 + (long)plVar10);
      do {
        *plVar10 = *(long *)source;
        plVar10 = plVar10 + 1;
        source = (char *)((long)source + 8);
      } while (plVar10 < plVar33);
      do {
        *(short *)plVar33 = (short)plVar9 - (short)piVar16;
        puVar1 = (ulong *)((long)plVar9 + 4);
        puVar38 = (ulong *)(piVar16 + 1);
        puVar31 = puVar1;
        if (piVar2 + -3 <= puVar1) {
LAB_001108ac:
          iVar12 = ((int)puVar31 - (int)plVar9) + -4;
LAB_001108b5:
          if (puVar31 < piVar2 + -3) {
            if (*puVar38 == *puVar31) goto code_r0x001108c9;
            uVar13 = *puVar31 ^ *puVar38;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar19 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar12;
          }
          else {
            if ((puVar31 < piVar2 + -2) && ((int)*puVar38 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar38 = (ulong *)((long)puVar38 + 4);
            }
            if ((puVar31 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar38 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar38 = (ulong *)((long)puVar38 + 2);
            }
            if (puVar31 < (ulong *)((long)piVar2 - 5U)) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
            }
            uVar19 = (int)puVar31 - (int)puVar1;
          }
          goto LAB_001108f6;
        }
        if (*puVar38 == *puVar1) {
          puVar38 = (ulong *)(piVar16 + 3);
          puVar31 = (ulong *)((long)plVar9 + 0xc);
          goto LAB_001108ac;
        }
        uVar13 = *puVar1 ^ *puVar38;
        uVar20 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar19 = (uint)(uVar20 >> 3) & 0x1fffffff;
LAB_001108f6:
        if (pcVar30 < (char *)((long)plVar33 + (ulong)(uVar19 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar39 = (char *)((long)plVar33 + 2);
        if (uVar19 < 0xf) {
          *dest = *dest + (char)uVar19;
        }
        else {
          *dest = *dest + '\x0f';
          pcVar39[0] = -1;
          pcVar39[1] = -1;
          pcVar39[2] = -1;
          pcVar39[3] = -1;
          lVar26 = 0;
          for (uVar11 = uVar19 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
            pcVar39 = (char *)((long)plVar33 + lVar26 + 6);
            pcVar39[0] = -1;
            pcVar39[1] = -1;
            pcVar39[2] = -1;
            pcVar39[3] = -1;
            lVar26 = lVar26 + 4;
          }
          lVar14 = lVar26 + (ulong)(uVar11 & 0xffff) / 0xff;
          pcVar39 = (char *)((long)plVar33 + lVar14 + 3);
          *(char *)((long)plVar33 + lVar14 + 2) =
               (char)lVar26 + (char)((uVar11 & 0xffff) / 0xff) + (char)uVar19 + -0xf;
        }
        lVar26 = (long)plVar9 + (ulong)uVar19;
        source = (char *)(lVar26 + 4);
        dest = pcVar39;
        if ((long *)((long)piVar2 - 0xbU) <= source) goto LAB_00110b63;
        *(int *)((long)LZ4_stream +
                ((ulong)(*(long *)(lVar26 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar26 + 2) - iVar6;
        uVar20 = (ulong)(*(long *)source * -0x30e4432345000000) >> 0x34;
        uVar11 = (int)source - iVar6;
        uVar19 = *(uint *)((long)LZ4_stream + uVar20 * 4);
        piVar16 = (int *)((ulong)uVar19 + lVar25);
        *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar11;
        if ((uVar19 + 0xffff < uVar11) || (*piVar16 != *(int *)source)) goto LAB_00110736;
        plVar33 = (long *)(pcVar39 + 1);
        *pcVar39 = '\0';
        plVar9 = (long *)source;
      } while( true );
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    pcVar30 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = uVar19 + inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar11 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    local_b8 = dest;
    if ((uint)inputSize < 0xd) {
LAB_00110af2:
      uVar20 = (long)piVar2 - (long)source;
      if (pcVar30 < local_b8 + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
        return 0;
      }
      if (uVar20 < 0xf) {
        *local_b8 = (char)uVar20 << 4;
      }
      else {
        *local_b8 = -0x10;
        for (uVar13 = uVar20 - 0xf; local_b8 = local_b8 + 1, 0xfe < uVar13; uVar13 = uVar13 - 0xff)
        {
          *local_b8 = -1;
        }
        *local_b8 = (char)uVar13;
      }
      memcpy(local_b8 + 1,source,uVar20);
      return ((int)(local_b8 + 1) + (int)uVar20) - local_88;
    }
    piVar22 = (int *)(source + -uVar20);
    *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
         uVar11;
    plVar10 = (long *)source;
LAB_00110385:
    iVar7 = 1;
    lVar26 = *(long *)((long)plVar10 + 1);
    plVar9 = (long *)((long)plVar10 + 1);
    iVar12 = acceleration << 6;
    while( true ) {
      plVar33 = (long *)((long)iVar7 + (long)plVar9);
      source = (char *)plVar10;
      if ((long *)((long)piVar2 - 0xbU) < plVar33) goto LAB_00110af2;
      uVar20 = (ulong)(lVar26 * -0x30e4432345000000) >> 0x34;
      uVar18 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      iVar7 = (int)plVar9;
      lVar26 = *plVar33;
      *(int *)((long)LZ4_stream + uVar20 * 4) = iVar7 - iVar6;
      if (((uVar11 - uVar19 <= uVar18) && ((uint)(iVar7 - iVar6) <= uVar18 + 0xffff)) &&
         (*(int *)(lVar25 + (ulong)uVar18) == (int)*plVar9)) break;
      iVar7 = iVar12 >> 6;
      iVar12 = iVar12 + 1;
      plVar9 = plVar33;
    }
    lVar14 = (ulong)uVar18 + lVar25;
    lVar26 = 0;
    cVar4 = (char)plVar9 * '\x10' + (char)plVar10 * -0x10;
    do {
      cVar5 = cVar4;
      lVar17 = lVar26;
      piVar16 = (int *)(lVar14 + lVar17);
      source = (char *)((long)plVar9 + lVar17);
      if ((piVar16 <= piVar22) || (source <= plVar10)) break;
      lVar26 = lVar17 + -1;
      cVar4 = cVar5 + -0x10;
    } while (*(char *)((long)plVar9 + lVar17 + -1) == *(char *)(lVar14 + -1 + lVar17));
    uVar18 = iVar7 - (int)plVar10;
    uVar13 = (ulong)(uVar18 + (int)lVar17);
    uVar20 = (ulong)uVar18 + lVar17;
    if (pcVar30 < local_b8 + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9) {
      return 0;
    }
    if ((uint)uVar20 < 0xf) {
      plVar9 = (long *)(local_b8 + 1);
      *local_b8 = cVar5;
    }
    else {
      *local_b8 = -0x10;
      plVar9 = (long *)(local_b8 + 2);
      for (iVar12 = (iVar7 - (int)plVar10) + (int)lVar17 + -0xf; 0xfe < iVar12;
          iVar12 = iVar12 + -0xff) {
        *(char *)((long)plVar9 + -1) = -1;
        plVar9 = (long *)((long)plVar9 + 1);
      }
      *(char *)((long)plVar9 + -1) = (char)iVar12;
    }
    plVar33 = (long *)(uVar13 + (long)plVar9);
    do {
      *plVar9 = *plVar10;
      plVar9 = plVar9 + 1;
      plVar10 = plVar10 + 1;
      pcVar39 = local_b8;
    } while (plVar9 < plVar33);
    do {
      *(short *)plVar33 = (short)source - (short)piVar16;
      puVar1 = (ulong *)((long)source + 4);
      puVar38 = (ulong *)(piVar16 + 1);
      puVar31 = puVar1;
      if (piVar2 + -3 <= puVar1) {
LAB_0011054e:
        iVar12 = ((int)puVar31 - (int)source) + -4;
LAB_00110557:
        if (puVar31 < piVar2 + -3) {
          if (*puVar38 == *puVar31) goto code_r0x0011056b;
          uVar13 = *puVar31 ^ *puVar38;
          uVar20 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar18 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar12;
        }
        else {
          if ((puVar31 < piVar2 + -2) && ((int)*puVar38 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar38 = (ulong *)((long)puVar38 + 4);
          }
          if ((puVar31 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar38 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar38 = (ulong *)((long)puVar38 + 2);
          }
          if (puVar31 < (ulong *)((long)piVar2 - 5U)) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
          }
          uVar18 = (int)puVar31 - (int)puVar1;
        }
        goto LAB_0011059e;
      }
      if (*puVar38 == *puVar1) {
        puVar38 = (ulong *)(piVar16 + 3);
        puVar31 = (ulong *)((long)source + 0xc);
        goto LAB_0011054e;
      }
      uVar20 = *puVar1 ^ *puVar38;
      lVar26 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      uVar18 = (uint)lVar26 >> 3;
LAB_0011059e:
      if (pcVar30 < (char *)((long)plVar33 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      local_b8 = (char *)((long)plVar33 + 2);
      if (uVar18 < 0xf) {
        *pcVar39 = *pcVar39 + (char)uVar18;
      }
      else {
        *pcVar39 = *pcVar39 + '\x0f';
        local_b8[0] = -1;
        local_b8[1] = -1;
        local_b8[2] = -1;
        local_b8[3] = -1;
        lVar26 = 0;
        for (uVar32 = uVar18 - 0xf; 0x3fb < uVar32; uVar32 = uVar32 - 0x3fc) {
          pcVar39 = (char *)((long)plVar33 + lVar26 + 6);
          pcVar39[0] = -1;
          pcVar39[1] = -1;
          pcVar39[2] = -1;
          pcVar39[3] = -1;
          lVar26 = lVar26 + 4;
        }
        lVar14 = lVar26 + ((ulong)uVar32 & 0xffff) / 0xff;
        local_b8 = (char *)((long)plVar33 + lVar14 + 3);
        *(char *)((long)plVar33 + lVar14 + 2) =
             (char)lVar26 + (char)((ushort)uVar32 / 0xff) + (char)uVar18 + -0xf;
      }
      lVar26 = (long)source + (ulong)uVar18;
      source = (char *)(lVar26 + 4);
      if ((long *)((long)piVar2 - 0xbU) <= source) goto LAB_00110af2;
      *(int *)((long)LZ4_stream + ((ulong)(*(long *)(lVar26 + 2) * -0x30e4432345000000) >> 0x34) * 4
              ) = ((int)lVar26 + 2) - iVar6;
      uVar20 = (ulong)(*(long *)source * -0x30e4432345000000) >> 0x34;
      uVar32 = (int)source - iVar6;
      uVar18 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      piVar16 = (int *)((ulong)uVar18 + lVar25);
      *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar32;
      plVar10 = (long *)source;
      if (((uVar18 < uVar11 - uVar19) || (uVar18 + 0xffff < uVar32)) || (*piVar16 != *(int *)source)
         ) goto LAB_00110385;
      plVar33 = (long *)(local_b8 + 1);
      *local_b8 = '\0';
      pcVar39 = local_b8;
    } while( true );
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  puVar38 = (ulong *)source;
  local_c8 = (U32 *)dest;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    uVar11 = (LZ4_stream->internal_donotuse).currentOffset;
    lVar26 = (long)source - (ulong)uVar11;
    lVar25 = -(ulong)uVar11;
    iVar6 = (int)lVar26;
    if (uVar19 < uVar11 && uVar19 < 0x10000) {
      if ((uint)inputSize < 0x7e000001) {
        pcVar30 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar19 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar11 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < (uint)inputSize) {
          puVar1 = (ulong *)((long)piVar2 - 5);
          lVar25 = (long)piVar22 + lVar25 + uVar20;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar11;
          puVar31 = (ulong *)(piVar2 + -3);
LAB_0010f03a:
          iVar7 = 1;
          uVar13 = *(ulong *)((long)puVar38 + 1);
          puVar8 = (ulong *)((long)puVar38 + 1);
          iVar12 = acceleration << 6;
          do {
            puVar27 = (ulong *)((long)iVar7 + (long)puVar8);
            dest = (char *)local_c8;
            if ((ulong *)((long)piVar2 - 0xbU) < puVar27) break;
            uVar15 = uVar13 * -0x30e4432345000000 >> 0x34;
            iVar7 = (int)puVar8;
            uVar32 = iVar7 - iVar6;
            uVar18 = *(uint *)((long)LZ4_stream + uVar15 * 4);
            uVar13 = *puVar27;
            *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar32;
            if ((uVar11 - uVar19 <= uVar18) && (uVar32 <= uVar18 + 0xffff)) {
              lVar14 = lVar25;
              if (uVar11 <= uVar18) {
                lVar14 = lVar26;
              }
              if (*(int *)(lVar14 + (ulong)uVar18) == (int)*puVar8) goto LAB_0010f0a5;
            }
            iVar7 = iVar12 >> 6;
            iVar12 = iVar12 + 1;
            puVar8 = puVar27;
          } while( true );
        }
LAB_00110bd6:
        uVar20 = (long)piVar2 - (long)puVar38;
        iVar37 = 0;
        if (pcVar30 < (char *)((long)dest + (uVar20 + 0xf0) / 0xff + uVar20 + 1)) goto LAB_00110cd9;
        hashTable_16 = (U32 *)dest;
        if (uVar20 < 0xf) goto LAB_00110c95;
        *dest = -0x10;
        for (uVar13 = uVar20 - 0xf; hashTable_16 = (U32 *)((long)dest + 1), 0xfe < uVar13;
            uVar13 = uVar13 - 0xff) {
          *(char *)hashTable_16 = -1;
          dest = (char *)hashTable_16;
        }
        goto LAB_00110c9f;
      }
    }
    else if ((uint)inputSize < 0x7e000001) {
      pcVar30 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar19 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar11 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        puVar1 = (ulong *)((long)piVar2 - 5);
        lVar25 = (long)piVar22 + lVar25 + uVar20;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar11;
        puVar31 = (ulong *)(piVar2 + -3);
LAB_0010fdcd:
        iVar7 = 1;
        uVar13 = *(ulong *)((long)puVar38 + 1);
        puVar8 = (ulong *)((long)puVar38 + 1);
        iVar12 = acceleration << 6;
        do {
          puVar27 = (ulong *)((long)iVar7 + (long)puVar8);
          dest = (char *)local_c8;
          if ((ulong *)((long)piVar2 - 0xbU) < puVar27) break;
          uVar15 = uVar13 * -0x30e4432345000000 >> 0x34;
          iVar7 = (int)puVar8;
          uVar18 = iVar7 - iVar6;
          uVar19 = *(uint *)((long)LZ4_stream + uVar15 * 4);
          uVar13 = *puVar27;
          *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar18;
          if (uVar18 <= uVar19 + 0xffff) {
            lVar14 = lVar25;
            if (uVar11 <= uVar19) {
              lVar14 = lVar26;
            }
            if (*(int *)(lVar14 + (ulong)uVar19) == (int)*puVar8) goto LAB_0010fe32;
          }
          iVar7 = iVar12 >> 6;
          iVar12 = iVar12 + 1;
          puVar8 = puVar27;
        } while( true );
      }
LAB_00110c3f:
      uVar20 = (long)piVar2 - (long)puVar38;
      iVar37 = 0;
      if (pcVar30 < (char *)((long)dest + (uVar20 + 0xf0) / 0xff + uVar20 + 1)) goto LAB_00110cd9;
      hashTable_16 = (U32 *)dest;
      if (uVar20 < 0xf) goto LAB_00110c95;
      *dest = -0x10;
      for (uVar13 = uVar20 - 0xf; hashTable_16 = (U32 *)((long)dest + 1), 0xfe < uVar13;
          uVar13 = uVar13 - 0xff) {
        *(char *)hashTable_16 = -1;
        dest = (char *)hashTable_16;
      }
      goto LAB_00110c9f;
    }
  }
  else {
    if (0x1000 < inputSize) {
      memcpy(LZ4_stream,__src,0x4020);
      if ((uint)inputSize < 0x7e000001) {
        uVar19 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar26 = (long)source - (ulong)uVar19;
        piVar22 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        uVar11 = (LZ4_stream->internal_donotuse).dictSize;
        puVar1 = (ulong *)((long)piVar2 - 5);
        lVar25 = (long)piVar22 + ((ulong)uVar11 - (ulong)uVar19);
        pcVar30 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar11 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar19 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar19;
        puVar31 = (ulong *)(piVar2 + -3);
        hashTable_16 = (U32 *)dest;
LAB_0010e937:
        iVar12 = 1;
        uVar20 = *(ulong *)((long)puVar38 + 1);
        puVar8 = (ulong *)((long)puVar38 + 1);
        iVar6 = acceleration << 6;
        do {
          puVar27 = (ulong *)((long)iVar12 + (long)puVar8);
          if ((ulong *)((long)piVar2 - 0xbU) < puVar27) goto LAB_0010fca4;
          uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
          iVar12 = (int)puVar8;
          iVar7 = (int)lVar26;
          uVar32 = iVar12 - iVar7;
          uVar18 = *(uint *)((long)LZ4_stream + uVar13 * 4);
          uVar20 = *puVar27;
          *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar32;
          if (uVar32 <= uVar18 + 0xffff) {
            lVar14 = lVar25;
            if (uVar19 <= uVar18) {
              lVar14 = lVar26;
            }
            if (*(int *)(lVar14 + (ulong)uVar18) == (int)*puVar8) goto LAB_0010e99c;
          }
          iVar12 = iVar6 >> 6;
          iVar6 = iVar6 + 1;
          puVar8 = puVar27;
        } while( true );
      }
      goto LAB_0010fc97;
    }
    if ((uint)inputSize < 0x7e000001) {
      uVar19 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar22 = (int *)__src->dictionary;
      uVar11 = __src->dictSize;
      uVar18 = __src->currentOffset;
      LZ4_stream->table[0x802] = 0;
      pcVar30 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar19 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar26 = (long)source - (ulong)uVar19;
        iVar6 = uVar19 - uVar18;
        puVar1 = (ulong *)((long)piVar2 - 5);
        lVar25 = (ulong)uVar11 - (ulong)uVar18;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar19;
        puVar31 = (ulong *)(piVar2 + -3);
LAB_0010f6a9:
        uVar20 = *(ulong *)((long)puVar38 + 1);
        iVar12 = 1;
        puVar8 = (ulong *)((long)puVar38 + 1);
        iVar7 = acceleration << 6;
        while( true ) {
          puVar27 = (ulong *)((long)iVar12 + (long)puVar8);
          dest = (char *)local_c8;
          if ((ulong *)((long)piVar2 - 0xbU) < puVar27) goto LAB_00110a89;
          uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
          uVar18 = *(uint *)((long)LZ4_stream + uVar13 * 4);
          if (uVar18 < uVar19) {
            uVar18 = __src->hashTable[uVar13] + iVar6;
            piVar16 = (int *)((long)piVar22 + (ulong)__src->hashTable[uVar13] + lVar25);
            piVar35 = piVar22;
          }
          else {
            piVar16 = (int *)(lVar26 + (ulong)uVar18);
            piVar35 = (int *)source;
          }
          iVar12 = (int)puVar8;
          iVar34 = (int)lVar26;
          uVar32 = iVar12 - iVar34;
          uVar20 = *puVar27;
          *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar32;
          if ((uVar32 <= uVar18 + 0xffff) && (*piVar16 == (int)*puVar8)) break;
          iVar12 = iVar7 >> 6;
          iVar7 = iVar7 + 1;
          puVar8 = puVar27;
        }
        iVar7 = uVar32 - uVar18;
        lVar14 = 0;
        cVar4 = (char)puVar8 * '\x10' + (char)puVar38 * -0x10;
        do {
          cVar5 = cVar4;
          lVar17 = lVar14;
          piVar36 = (int *)((long)piVar16 + lVar17);
          puVar27 = (ulong *)((long)puVar8 + lVar17);
          if ((piVar36 <= piVar35) || (puVar27 <= puVar38)) break;
          lVar14 = lVar17 + -1;
          cVar4 = cVar5 + -0x10;
        } while (*(char *)((long)puVar8 + lVar17 + -1) == *(char *)((long)piVar16 + lVar17 + -1));
        uVar18 = iVar12 - (int)puVar38;
        uVar13 = (ulong)(uVar18 + (int)lVar17);
        uVar20 = (ulong)uVar18 + lVar17;
        iVar37 = 0;
        if ((char *)((long)local_c8 + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9) <= pcVar30) {
          if ((uint)uVar20 < 0xf) {
            puVar8 = (ulong *)((long)local_c8 + 1);
            *(char *)local_c8 = cVar5;
          }
          else {
            *(char *)local_c8 = -0x10;
            puVar8 = (ulong *)((long)local_c8 + 2);
            for (iVar12 = (iVar12 - (int)puVar38) + (int)lVar17 + -0xf; 0xfe < iVar12;
                iVar12 = iVar12 + -0xff) {
              *(char *)((long)puVar8 + -1) = -1;
              puVar8 = (ulong *)((long)puVar8 + 1);
            }
            *(char *)((long)puVar8 + -1) = (char)iVar12;
          }
          puVar28 = (ulong *)(uVar13 + (long)puVar8);
          do {
            *puVar8 = *puVar38;
            puVar8 = puVar8 + 1;
            puVar38 = puVar38 + 1;
          } while (puVar8 < puVar28);
          do {
            *(short *)puVar28 = (short)iVar7;
            if (piVar35 == piVar22) {
              puVar8 = (ulong *)((long)piVar22 + ((ulong)uVar11 - (long)piVar36) + (long)puVar27);
              if (puVar1 < puVar8) {
                puVar8 = puVar1;
              }
              puVar38 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)(piVar36 + 1);
              puVar24 = puVar38;
              if ((ulong *)((long)puVar8 - 7U) <= puVar38) {
LAB_0010f9da:
                iVar12 = ((int)puVar24 - (int)puVar27) + -4;
LAB_0010f9e4:
                if (puVar24 < (ulong *)((long)puVar8 - 7U)) {
                  if (*puVar23 == *puVar24) goto code_r0x0010f9f8;
                  uVar13 = *puVar24 ^ *puVar23;
                  uVar20 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar18 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar12;
                }
                else {
                  if ((puVar24 < (ulong *)((long)puVar8 - 3U)) && ((int)*puVar23 == (int)*puVar24))
                  {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar24 < (ulong *)((long)puVar8 - 1U)) &&
                     ((short)*puVar23 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar24 < puVar8) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar23 == (char)*puVar24));
                  }
                  uVar18 = (int)puVar24 - (int)puVar38;
                }
                goto LAB_0010fa4a;
              }
              if (*puVar23 == *puVar38) {
                puVar23 = (ulong *)(piVar36 + 3);
                puVar24 = (ulong *)((long)puVar27 + 0xc);
                goto LAB_0010f9da;
              }
              uVar20 = *puVar38 ^ *puVar23;
              lVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar18 = (uint)lVar14 >> 3;
LAB_0010fa4a:
              puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
              if (puVar38 == puVar8) {
                puVar38 = puVar8;
                puVar23 = (ulong *)source;
                if (puVar31 <= puVar8) {
LAB_0010fa7d:
                  pcVar39 = (char *)((long)puVar27 + (long)piVar22 + ((ulong)uVar11 - (long)piVar36)
                                    );
                  if (source + (long)inputSize + -5 <= pcVar39) {
                    pcVar39 = source + (long)inputSize + -5;
                  }
                  iVar12 = (int)puVar38 - (int)pcVar39;
LAB_0010fa99:
                  if (puVar38 < puVar31) {
                    if (*puVar23 == *puVar38) goto code_r0x0010faad;
                    uVar13 = *puVar38 ^ *puVar23;
                    uVar20 = 0;
                    if (uVar13 != 0) {
                      for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar32 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar12;
                  }
                  else {
                    if ((puVar38 < piVar2 + -2) && ((int)*puVar23 == (int)*puVar38)) {
                      puVar38 = (ulong *)((long)puVar38 + 4);
                      puVar23 = (ulong *)((long)puVar23 + 4);
                    }
                    if ((puVar38 < (ulong *)((long)piVar2 - 6U)) &&
                       ((short)*puVar23 == (short)*puVar38)) {
                      puVar38 = (ulong *)((long)puVar38 + 2);
                      puVar23 = (ulong *)((long)puVar23 + 2);
                    }
                    if (puVar38 < puVar1) {
                      puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar23 == (char)*puVar38))
                      ;
                    }
                    uVar32 = (int)puVar38 - (int)puVar8;
                  }
                  goto LAB_0010fad2;
                }
                if (*(ulong *)source == *puVar8) {
                  puVar38 = puVar8 + 1;
                  puVar23 = (ulong *)(source + 8);
                  goto LAB_0010fa7d;
                }
                uVar20 = *puVar8 ^ *(ulong *)source;
                lVar14 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar32 = (uint)lVar14 >> 3;
LAB_0010fad2:
                uVar18 = uVar18 + uVar32;
                puVar38 = (ulong *)((long)puVar8 + (ulong)uVar32);
              }
            }
            else {
              puVar38 = (ulong *)((long)puVar27 + 4);
              puVar8 = (ulong *)(piVar36 + 1);
              puVar23 = puVar38;
              if (puVar31 <= puVar38) {
LAB_0010f964:
                iVar12 = ((int)puVar23 - (int)puVar27) + -4;
LAB_0010f96c:
                if (puVar23 < puVar31) {
                  if (*puVar8 == *puVar23) goto code_r0x0010f984;
                  uVar13 = *puVar23 ^ *puVar8;
                  uVar20 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar18 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar12;
                }
                else {
                  if ((puVar23 < piVar2 + -2) && ((int)*puVar8 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar8 = (ulong *)((long)puVar8 + 4);
                  }
                  if ((puVar23 < (ulong *)((long)piVar2 - 6U)) &&
                     ((short)*puVar8 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar8 = (ulong *)((long)puVar8 + 2);
                  }
                  if (puVar23 < puVar1) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar8 == (char)*puVar23));
                  }
                  uVar18 = (int)puVar23 - (int)puVar38;
                }
                goto LAB_0010fa23;
              }
              if (*puVar8 == *puVar38) {
                puVar8 = (ulong *)(piVar36 + 3);
                puVar23 = (ulong *)((long)puVar27 + 0xc);
                goto LAB_0010f964;
              }
              uVar20 = *puVar38 ^ *puVar8;
              lVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar18 = (uint)lVar14 >> 3;
LAB_0010fa23:
              puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
            }
            iVar37 = 0;
            if (pcVar30 < (char *)((long)puVar28 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) break;
            dest = (char *)((long)puVar28 + 2);
            if (uVar18 < 0xf) {
              *(char *)local_c8 = (char)*local_c8 + (char)uVar18;
            }
            else {
              *(char *)local_c8 = (char)*local_c8 + '\x0f';
              *(U32 *)dest = 0xffffffff;
              lVar14 = 0;
              for (uVar32 = uVar18 - 0xf; 0x3fb < uVar32; uVar32 = uVar32 - 0x3fc) {
                pcVar39 = (char *)((long)puVar28 + lVar14 + 6);
                pcVar39[0] = -1;
                pcVar39[1] = -1;
                pcVar39[2] = -1;
                pcVar39[3] = -1;
                lVar14 = lVar14 + 4;
              }
              lVar17 = lVar14 + ((ulong)uVar32 & 0xffff) / 0xff;
              dest = (char *)((long)puVar28 + lVar17 + 3);
              *(char *)((long)puVar28 + lVar17 + 2) =
                   (char)lVar14 + (char)((ushort)uVar32 / 0xff) + (char)uVar18 + -0xf;
            }
            if ((ulong *)((long)piVar2 - 0xbU) <= puVar38) goto LAB_00110a89;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)puVar38 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar38 + -2) - iVar34;
            uVar20 = *puVar38 * -0x30e4432345000000 >> 0x34;
            uVar18 = *(uint *)((long)LZ4_stream + uVar20 * 4);
            if (uVar18 < uVar19) {
              uVar18 = iVar6 + __src->hashTable[uVar20];
              piVar36 = (int *)((long)piVar22 + (ulong)__src->hashTable[uVar20] + lVar25);
              piVar35 = piVar22;
            }
            else {
              piVar36 = (int *)(lVar26 + (ulong)uVar18);
              piVar35 = (int *)source;
            }
            uVar32 = (int)puVar38 - iVar34;
            *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar32;
            local_c8 = (U32 *)dest;
            if ((uVar18 + 0xffff < uVar32) || (*piVar36 != (int)*puVar38)) goto LAB_0010f6a9;
            puVar28 = (ulong *)((long)dest + 1);
            *dest = '\0';
            iVar7 = uVar32 - uVar18;
            puVar27 = puVar38;
          } while( true );
        }
        goto LAB_00110cd9;
      }
LAB_00110a89:
      uVar20 = (long)piVar2 - (long)puVar38;
      iVar37 = 0;
      if (pcVar30 < (char *)((long)dest + (uVar20 + 0xf0) / 0xff + uVar20 + 1)) goto LAB_00110cd9;
      if (uVar20 < 0xf) {
        *dest = (char)uVar20 << 4;
      }
      else {
        *dest = -0x10;
        for (uVar13 = uVar20 - 0xf; dest = (char *)((long)dest + 1), 0xfe < uVar13;
            uVar13 = uVar13 - 0xff) {
          *dest = -1;
        }
        *dest = (char)uVar13;
      }
      goto LAB_00110cc9;
    }
  }
LAB_0010fc97:
  iVar37 = 0;
LAB_00110cd9:
  (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar37;
code_r0x001108c9:
  puVar31 = puVar31 + 1;
  puVar38 = puVar38 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_001108b5;
code_r0x0011056b:
  puVar31 = puVar31 + 1;
  puVar38 = puVar38 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_00110557;
LAB_0010fe32:
  lVar14 = lVar14 + (ulong)uVar19;
  piVar16 = (int *)source;
  if (uVar19 < uVar11) {
    piVar16 = piVar22;
  }
  iVar12 = uVar18 - uVar19;
  lVar17 = 0;
  cVar4 = (char)puVar8 * '\x10' + (char)puVar38 * -0x10;
  do {
    cVar5 = cVar4;
    lVar29 = lVar17;
    piVar35 = (int *)(lVar14 + lVar29);
    puVar27 = (ulong *)((long)puVar8 + lVar29);
    if ((piVar35 <= piVar16) || (puVar27 <= puVar38)) break;
    lVar17 = lVar29 + -1;
    cVar4 = cVar5 + -0x10;
  } while (*(char *)((long)puVar8 + lVar29 + -1) == *(char *)(lVar14 + -1 + lVar29));
  uVar19 = iVar7 - (int)puVar38;
  uVar15 = (ulong)((int)lVar29 + uVar19);
  uVar13 = (ulong)uVar19 + lVar29;
  iVar37 = 0;
  if ((char *)((long)local_c8 + (uVar13 & 0xffffffff) / 0xff + uVar15 + 9) <= pcVar30) {
    if ((uint)uVar13 < 0xf) {
      puVar8 = (ulong *)((long)local_c8 + 1);
      *(char *)local_c8 = cVar5;
    }
    else {
      *(char *)local_c8 = -0x10;
      puVar8 = (ulong *)((long)local_c8 + 2);
      for (iVar7 = (iVar7 - (int)puVar38) + (int)lVar29 + -0xf; 0xfe < iVar7; iVar7 = iVar7 + -0xff)
      {
        *(char *)((long)puVar8 + -1) = -1;
        puVar8 = (ulong *)((long)puVar8 + 1);
      }
      *(char *)((long)puVar8 + -1) = (char)iVar7;
    }
    puVar28 = (ulong *)(uVar15 + (long)puVar8);
    do {
      *puVar8 = *puVar38;
      puVar8 = puVar8 + 1;
      puVar38 = puVar38 + 1;
    } while (puVar8 < puVar28);
    do {
      *(short *)puVar28 = (short)iVar12;
      if (piVar16 == piVar22) {
        puVar8 = (ulong *)((long)piVar22 + (uVar20 - (long)piVar35) + (long)puVar27);
        if (puVar1 < puVar8) {
          puVar8 = puVar1;
        }
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar23 = (ulong *)(piVar35 + 1);
        puVar24 = puVar38;
        if ((ulong *)((long)puVar8 - 7U) <= puVar38) {
LAB_001100c8:
          iVar12 = ((int)puVar24 - (int)puVar27) + -4;
LAB_001100d2:
          if (puVar24 < (ulong *)((long)puVar8 - 7U)) {
            if (*puVar23 == *puVar24) goto code_r0x001100e6;
            uVar15 = *puVar24 ^ *puVar23;
            uVar13 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar19 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
          }
          else {
            if ((puVar24 < (ulong *)((long)puVar8 - 3U)) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < (ulong *)((long)puVar8 - 1U)) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar8) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar23 == (char)*puVar24));
            }
            uVar19 = (int)puVar24 - (int)puVar38;
          }
          goto LAB_00110138;
        }
        if (*puVar23 == *puVar38) {
          puVar23 = (ulong *)(piVar35 + 3);
          puVar24 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_001100c8;
        }
        uVar13 = *puVar38 ^ *puVar23;
        lVar14 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar19 = (uint)lVar14 >> 3;
LAB_00110138:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar19 + 4);
        if (puVar38 == puVar8) {
          puVar38 = puVar8;
          puVar23 = (ulong *)source;
          if (puVar31 <= puVar8) {
LAB_00110177:
            pcVar39 = (char *)((long)puVar27 + (long)piVar22 + (uVar20 - (long)piVar35));
            if (source + (long)inputSize + -5 <= pcVar39) {
              pcVar39 = source + (long)inputSize + -5;
            }
            iVar12 = (int)puVar38 - (int)pcVar39;
LAB_00110193:
            if (puVar38 < puVar31) {
              if (*puVar23 == *puVar38) goto code_r0x001101a7;
              uVar15 = *puVar38 ^ *puVar23;
              uVar13 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar18 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
            }
            else {
              if ((puVar38 < piVar2 + -2) && ((int)*puVar23 == (int)*puVar38)) {
                puVar38 = (ulong *)((long)puVar38 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar38 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar23 == (short)*puVar38))
              {
                puVar38 = (ulong *)((long)puVar38 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar38 < puVar1) {
                puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar23 == (char)*puVar38));
              }
              uVar18 = (int)puVar38 - (int)puVar8;
            }
            goto LAB_001101cc;
          }
          if (*(ulong *)source == *puVar8) {
            puVar38 = puVar8 + 1;
            puVar23 = (ulong *)(source + 8);
            goto LAB_00110177;
          }
          uVar13 = *puVar8 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar18 = (uint)lVar14 >> 3;
LAB_001101cc:
          uVar19 = uVar19 + uVar18;
          puVar38 = (ulong *)((long)puVar8 + (ulong)uVar18);
        }
      }
      else {
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar8 = (ulong *)(piVar35 + 1);
        puVar23 = puVar38;
        if (puVar31 <= puVar38) {
LAB_0011005a:
          iVar12 = ((int)puVar23 - (int)puVar27) + -4;
LAB_00110062:
          if (puVar23 < puVar31) {
            if (*puVar8 == *puVar23) goto code_r0x0011007a;
            uVar15 = *puVar23 ^ *puVar8;
            uVar13 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar19 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
          }
          else {
            if ((puVar23 < piVar2 + -2) && ((int)*puVar8 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar23 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar8 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar23 < puVar1) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar8 == (char)*puVar23));
            }
            uVar19 = (int)puVar23 - (int)puVar38;
          }
          goto LAB_00110111;
        }
        if (*puVar8 == *puVar38) {
          puVar8 = (ulong *)(piVar35 + 3);
          puVar23 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_0011005a;
        }
        uVar13 = *puVar38 ^ *puVar8;
        lVar14 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar19 = (uint)lVar14 >> 3;
LAB_00110111:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar19 + 4);
      }
      iVar37 = 0;
      if (pcVar30 < (char *)((long)puVar28 + (ulong)(uVar19 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar28 + 2);
      if (uVar19 < 0xf) {
        *(char *)local_c8 = (char)*local_c8 + (char)uVar19;
      }
      else {
        *(char *)local_c8 = (char)*local_c8 + '\x0f';
        *(U32 *)dest = 0xffffffff;
        lVar14 = 0;
        for (uVar18 = uVar19 - 0xf; 0x3fb < uVar18; uVar18 = uVar18 - 0x3fc) {
          pcVar39 = (char *)((long)puVar28 + lVar14 + 6);
          pcVar39[0] = -1;
          pcVar39[1] = -1;
          pcVar39[2] = -1;
          pcVar39[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar17 = lVar14 + ((ulong)uVar18 & 0xffff) / 0xff;
        dest = (char *)((long)puVar28 + lVar17 + 3);
        *(char *)((long)puVar28 + lVar17 + 2) =
             (char)lVar14 + (char)((uVar18 & 0xffff) / 0xff) + (char)uVar19 + -0xf;
      }
      if ((ulong *)((long)piVar2 - 0xbU) <= puVar38) goto LAB_00110c3f;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar38 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar38 + -2) - iVar6;
      uVar13 = *puVar38 * -0x30e4432345000000 >> 0x34;
      uVar18 = (int)puVar38 - iVar6;
      uVar19 = *(uint *)((long)LZ4_stream + uVar13 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar26;
      if (uVar19 < uVar11) {
        piVar16 = piVar22;
        lVar14 = lVar25;
      }
      piVar35 = (int *)(lVar14 + (ulong)uVar19);
      *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar18;
      local_c8 = (U32 *)dest;
      if ((uVar19 + 0xffff < uVar18) || (*piVar35 != (int)*puVar38)) goto LAB_0010fdcd;
      puVar28 = (ulong *)((long)dest + 1);
      *dest = '\0';
      iVar12 = uVar18 - uVar19;
      puVar27 = puVar38;
    } while( true );
  }
  goto LAB_00110cd9;
code_r0x001100e6:
  puVar24 = puVar24 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_001100d2;
code_r0x001101a7:
  puVar38 = puVar38 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_00110193;
code_r0x0011007a:
  puVar23 = puVar23 + 1;
  puVar8 = puVar8 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_00110062;
LAB_0010f0a5:
  lVar14 = lVar14 + (ulong)uVar18;
  piVar16 = (int *)source;
  if (uVar18 < uVar11) {
    piVar16 = piVar22;
  }
  iVar12 = uVar32 - uVar18;
  lVar17 = 0;
  cVar4 = (char)puVar8 * '\x10' + (char)puVar38 * -0x10;
  do {
    cVar5 = cVar4;
    lVar29 = lVar17;
    piVar35 = (int *)(lVar14 + lVar29);
    puVar27 = (ulong *)((long)puVar8 + lVar29);
    if ((piVar35 <= piVar16) || (puVar27 <= puVar38)) break;
    lVar17 = lVar29 + -1;
    cVar4 = cVar5 + -0x10;
  } while (*(char *)((long)puVar8 + lVar29 + -1) == *(char *)(lVar14 + -1 + lVar29));
  uVar18 = iVar7 - (int)puVar38;
  uVar13 = (ulong)((int)lVar29 + uVar18);
  uVar15 = (ulong)uVar18 + lVar29;
  iVar37 = 0;
  if ((char *)((long)local_c8 + (uVar15 & 0xffffffff) / 0xff + uVar13 + 9) <= pcVar30) {
    if ((uint)uVar15 < 0xf) {
      puVar8 = (ulong *)((long)local_c8 + 1);
      *(char *)local_c8 = cVar5;
    }
    else {
      *(char *)local_c8 = -0x10;
      puVar8 = (ulong *)((long)local_c8 + 2);
      for (iVar7 = (iVar7 - (int)puVar38) + (int)lVar29 + -0xf; 0xfe < iVar7; iVar7 = iVar7 + -0xff)
      {
        *(char *)((long)puVar8 + -1) = -1;
        puVar8 = (ulong *)((long)puVar8 + 1);
      }
      *(char *)((long)puVar8 + -1) = (char)iVar7;
    }
    puVar28 = (ulong *)(uVar13 + (long)puVar8);
    do {
      *puVar8 = *puVar38;
      puVar8 = puVar8 + 1;
      puVar38 = puVar38 + 1;
    } while (puVar8 < puVar28);
    do {
      *(short *)puVar28 = (short)iVar12;
      if (piVar16 == piVar22) {
        puVar8 = (ulong *)((long)piVar22 + (uVar20 - (long)piVar35) + (long)puVar27);
        if (puVar1 < puVar8) {
          puVar8 = puVar1;
        }
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar23 = (ulong *)(piVar35 + 1);
        puVar24 = puVar38;
        if ((ulong *)((long)puVar8 - 7U) <= puVar38) {
LAB_0010f34d:
          iVar12 = ((int)puVar24 - (int)puVar27) + -4;
LAB_0010f357:
          if (puVar24 < (ulong *)((long)puVar8 - 7U)) {
            if (*puVar23 == *puVar24) goto code_r0x0010f36b;
            uVar15 = *puVar24 ^ *puVar23;
            uVar13 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar18 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
          }
          else {
            if ((puVar24 < (ulong *)((long)puVar8 - 3U)) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < (ulong *)((long)puVar8 - 1U)) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar8) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar23 == (char)*puVar24));
            }
            uVar18 = (int)puVar24 - (int)puVar38;
          }
          goto LAB_0010f3bd;
        }
        if (*puVar23 == *puVar38) {
          puVar23 = (ulong *)(piVar35 + 3);
          puVar24 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_0010f34d;
        }
        uVar13 = *puVar38 ^ *puVar23;
        lVar14 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar18 = (uint)lVar14 >> 3;
LAB_0010f3bd:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
        if (puVar38 == puVar8) {
          puVar38 = puVar8;
          puVar23 = (ulong *)source;
          if (puVar31 <= puVar8) {
LAB_0010f3f6:
            pcVar39 = (char *)((long)puVar27 + (long)piVar22 + (uVar20 - (long)piVar35));
            if (source + (long)inputSize + -5 <= pcVar39) {
              pcVar39 = source + (long)inputSize + -5;
            }
            iVar12 = (int)puVar38 - (int)pcVar39;
LAB_0010f412:
            if (puVar38 < puVar31) {
              if (*puVar23 == *puVar38) goto code_r0x0010f426;
              uVar15 = *puVar38 ^ *puVar23;
              uVar13 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar32 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
            }
            else {
              if ((puVar38 < piVar2 + -2) && ((int)*puVar23 == (int)*puVar38)) {
                puVar38 = (ulong *)((long)puVar38 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar38 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar23 == (short)*puVar38))
              {
                puVar38 = (ulong *)((long)puVar38 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar38 < puVar1) {
                puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar23 == (char)*puVar38));
              }
              uVar32 = (int)puVar38 - (int)puVar8;
            }
            goto LAB_0010f44b;
          }
          if (*(ulong *)source == *puVar8) {
            puVar38 = puVar8 + 1;
            puVar23 = (ulong *)(source + 8);
            goto LAB_0010f3f6;
          }
          uVar13 = *puVar8 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar32 = (uint)lVar14 >> 3;
LAB_0010f44b:
          uVar18 = uVar18 + uVar32;
          puVar38 = (ulong *)((long)puVar8 + (ulong)uVar32);
        }
      }
      else {
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar8 = (ulong *)(piVar35 + 1);
        puVar23 = puVar38;
        if (puVar31 <= puVar38) {
LAB_0010f2df:
          iVar12 = ((int)puVar23 - (int)puVar27) + -4;
LAB_0010f2e7:
          if (puVar23 < puVar31) {
            if (*puVar8 == *puVar23) goto code_r0x0010f2ff;
            uVar15 = *puVar23 ^ *puVar8;
            uVar13 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar18 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar12;
          }
          else {
            if ((puVar23 < piVar2 + -2) && ((int)*puVar8 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar23 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar8 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar23 < puVar1) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar8 == (char)*puVar23));
            }
            uVar18 = (int)puVar23 - (int)puVar38;
          }
          goto LAB_0010f396;
        }
        if (*puVar8 == *puVar38) {
          puVar8 = (ulong *)(piVar35 + 3);
          puVar23 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_0010f2df;
        }
        uVar13 = *puVar38 ^ *puVar8;
        lVar14 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar18 = (uint)lVar14 >> 3;
LAB_0010f396:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
      }
      iVar37 = 0;
      if (pcVar30 < (char *)((long)puVar28 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar28 + 2);
      if (uVar18 < 0xf) {
        *(char *)local_c8 = (char)*local_c8 + (char)uVar18;
      }
      else {
        *(char *)local_c8 = (char)*local_c8 + '\x0f';
        *(U32 *)dest = 0xffffffff;
        lVar14 = 0;
        for (uVar32 = uVar18 - 0xf; 0x3fb < uVar32; uVar32 = uVar32 - 0x3fc) {
          pcVar39 = (char *)((long)puVar28 + lVar14 + 6);
          pcVar39[0] = -1;
          pcVar39[1] = -1;
          pcVar39[2] = -1;
          pcVar39[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar17 = lVar14 + ((ulong)uVar32 & 0xffff) / 0xff;
        dest = (char *)((long)puVar28 + lVar17 + 3);
        *(char *)((long)puVar28 + lVar17 + 2) =
             (char)lVar14 + (char)((uVar32 & 0xffff) / 0xff) + (char)uVar18 + -0xf;
      }
      if ((ulong *)((long)piVar2 - 0xbU) <= puVar38) goto LAB_00110bd6;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar38 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar38 + -2) - iVar6;
      uVar13 = *puVar38 * -0x30e4432345000000 >> 0x34;
      uVar32 = (int)puVar38 - iVar6;
      uVar18 = *(uint *)((long)LZ4_stream + uVar13 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar26;
      if (uVar18 < uVar11) {
        piVar16 = piVar22;
        lVar14 = lVar25;
      }
      piVar35 = (int *)(lVar14 + (ulong)uVar18);
      *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar32;
      local_c8 = (U32 *)dest;
      if (((uVar18 < uVar11 - uVar19) || (uVar18 + 0xffff < uVar32)) || (*piVar35 != (int)*puVar38))
      goto LAB_0010f03a;
      puVar28 = (ulong *)((long)dest + 1);
      *dest = '\0';
      iVar12 = uVar32 - uVar18;
      puVar27 = puVar38;
    } while( true );
  }
  goto LAB_00110cd9;
code_r0x0010f36b:
  puVar24 = puVar24 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010f357;
code_r0x0010f426:
  puVar38 = puVar38 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010f412;
code_r0x0010f2ff:
  puVar23 = puVar23 + 1;
  puVar8 = puVar8 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010f2e7;
LAB_0010e99c:
  lVar14 = lVar14 + (ulong)uVar18;
  piVar16 = (int *)source;
  if (uVar18 < uVar19) {
    piVar16 = piVar22;
  }
  iVar6 = uVar32 - uVar18;
  lVar17 = 0;
  cVar4 = (char)puVar8 * '\x10' + (char)puVar38 * -0x10;
  do {
    cVar5 = cVar4;
    lVar29 = lVar17;
    piVar35 = (int *)(lVar14 + lVar29);
    puVar27 = (ulong *)((long)puVar8 + lVar29);
    if ((piVar35 <= piVar16) || (puVar27 <= puVar38)) break;
    lVar17 = lVar29 + -1;
    cVar4 = cVar5 + -0x10;
  } while (*(char *)((long)puVar8 + lVar29 + -1) == *(char *)(lVar14 + -1 + lVar29));
  uVar18 = iVar12 - (int)puVar38;
  uVar13 = (ulong)((int)lVar29 + uVar18);
  uVar20 = (ulong)uVar18 + lVar29;
  iVar37 = 0;
  if ((char *)((long)hashTable_16 + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9) <= pcVar30) {
    if ((uint)uVar20 < 0xf) {
      puVar8 = (ulong *)((long)hashTable_16 + 1);
      *(char *)hashTable_16 = cVar5;
    }
    else {
      *(undefined1 *)hashTable_16 = 0xf0;
      puVar8 = (ulong *)((long)hashTable_16 + 2);
      for (iVar12 = (iVar12 - (int)puVar38) + (int)lVar29 + -0xf; 0xfe < iVar12;
          iVar12 = iVar12 + -0xff) {
        *(char *)((long)puVar8 + -1) = -1;
        puVar8 = (ulong *)((long)puVar8 + 1);
      }
      *(char *)((long)puVar8 + -1) = (char)iVar12;
    }
    puVar28 = (ulong *)(uVar13 + (long)puVar8);
    do {
      *puVar8 = *puVar38;
      puVar8 = puVar8 + 1;
      puVar38 = puVar38 + 1;
      pUVar21 = hashTable_16;
    } while (puVar8 < puVar28);
    do {
      *(short *)puVar28 = (short)iVar6;
      if (piVar16 == piVar22) {
        puVar8 = (ulong *)((long)piVar22 + ((ulong)uVar11 - (long)piVar35) + (long)puVar27);
        if (puVar1 < puVar8) {
          puVar8 = puVar1;
        }
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar23 = (ulong *)(piVar35 + 1);
        puVar24 = puVar38;
        if ((ulong *)((long)puVar8 - 7U) <= puVar38) {
LAB_0010ec36:
          iVar6 = ((int)puVar24 - (int)puVar27) + -4;
LAB_0010ec40:
          if (puVar24 < (ulong *)((long)puVar8 - 7U)) {
            if (*puVar23 == *puVar24) goto code_r0x0010ec54;
            uVar13 = *puVar24 ^ *puVar23;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar18 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar6;
          }
          else {
            if ((puVar24 < (ulong *)((long)puVar8 - 3U)) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < (ulong *)((long)puVar8 - 1U)) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar8) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar23 == (char)*puVar24));
            }
            uVar18 = (int)puVar24 - (int)puVar38;
          }
          goto LAB_0010eca6;
        }
        if (*puVar23 == *puVar38) {
          puVar23 = (ulong *)(piVar35 + 3);
          puVar24 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_0010ec36;
        }
        uVar20 = *puVar38 ^ *puVar23;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar18 = (uint)lVar14 >> 3;
LAB_0010eca6:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
        if (puVar38 == puVar8) {
          puVar38 = puVar8;
          puVar23 = (ulong *)source;
          if (puVar31 <= puVar8) {
LAB_0010ece5:
            pcVar39 = (char *)((long)puVar27 + (long)piVar22 + ((ulong)uVar11 - (long)piVar35));
            if (source + (long)inputSize + -5 <= pcVar39) {
              pcVar39 = source + (long)inputSize + -5;
            }
            iVar6 = (int)puVar38 - (int)pcVar39;
LAB_0010ed01:
            if (puVar38 < puVar31) {
              if (*puVar23 == *puVar38) goto code_r0x0010ed15;
              uVar13 = *puVar38 ^ *puVar23;
              uVar20 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar32 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar6;
            }
            else {
              if ((puVar38 < piVar2 + -2) && ((int)*puVar23 == (int)*puVar38)) {
                puVar38 = (ulong *)((long)puVar38 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar38 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar23 == (short)*puVar38))
              {
                puVar38 = (ulong *)((long)puVar38 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar38 < puVar1) {
                puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar23 == (char)*puVar38));
              }
              uVar32 = (int)puVar38 - (int)puVar8;
            }
            goto LAB_0010ed3a;
          }
          if (*(ulong *)source == *puVar8) {
            puVar38 = puVar8 + 1;
            puVar23 = (ulong *)(source + 8);
            goto LAB_0010ece5;
          }
          uVar20 = *puVar8 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar32 = (uint)lVar14 >> 3;
LAB_0010ed3a:
          uVar18 = uVar18 + uVar32;
          puVar38 = (ulong *)((long)puVar8 + (ulong)uVar32);
        }
      }
      else {
        puVar38 = (ulong *)((long)puVar27 + 4);
        puVar8 = (ulong *)(piVar35 + 1);
        puVar23 = puVar38;
        if (puVar31 <= puVar38) {
LAB_0010ebc8:
          iVar6 = ((int)puVar23 - (int)puVar27) + -4;
LAB_0010ebd0:
          if (puVar23 < puVar31) {
            if (*puVar8 == *puVar23) goto code_r0x0010ebe8;
            uVar13 = *puVar23 ^ *puVar8;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar18 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar6;
          }
          else {
            if ((puVar23 < piVar2 + -2) && ((int)*puVar8 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar23 < (ulong *)((long)piVar2 - 6U)) && ((short)*puVar8 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar23 < puVar1) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar8 == (char)*puVar23));
            }
            uVar18 = (int)puVar23 - (int)puVar38;
          }
          goto LAB_0010ec7f;
        }
        if (*puVar8 == *puVar38) {
          puVar8 = (ulong *)(piVar35 + 3);
          puVar23 = (ulong *)((long)puVar27 + 0xc);
          goto LAB_0010ebc8;
        }
        uVar20 = *puVar38 ^ *puVar8;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar18 = (uint)lVar14 >> 3;
LAB_0010ec7f:
        puVar38 = (ulong *)((long)puVar27 + (ulong)uVar18 + 4);
      }
      iVar37 = 0;
      if (pcVar30 < (char *)((long)puVar28 + (ulong)(uVar18 + 0xf0) / 0xff + 8)) break;
      hashTable_16 = (U32 *)((long)puVar28 + 2);
      if (uVar18 < 0xf) {
        *(char *)pUVar21 = (char)*pUVar21 + (char)uVar18;
      }
      else {
        *(char *)pUVar21 = (char)*pUVar21 + '\x0f';
        *hashTable_16 = 0xffffffff;
        lVar14 = 0;
        for (uVar32 = uVar18 - 0xf; 0x3fb < uVar32; uVar32 = uVar32 - 0x3fc) {
          pcVar39 = (char *)((long)puVar28 + lVar14 + 6);
          pcVar39[0] = -1;
          pcVar39[1] = -1;
          pcVar39[2] = -1;
          pcVar39[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar17 = lVar14 + ((ulong)uVar32 & 0xffff) / 0xff;
        hashTable_16 = (U32 *)((long)puVar28 + lVar17 + 3);
        *(char *)((long)puVar28 + lVar17 + 2) =
             (char)lVar14 + (char)((uVar32 & 0xffff) / 0xff) + (char)uVar18 + -0xf;
      }
      if ((ulong *)((long)piVar2 - 0xbU) <= puVar38) goto LAB_0010fca4;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar38 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar38 + -2) - iVar7;
      uVar20 = *puVar38 * -0x30e4432345000000 >> 0x34;
      uVar32 = (int)puVar38 - iVar7;
      uVar18 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar26;
      if (uVar18 < uVar19) {
        piVar16 = piVar22;
        lVar14 = lVar25;
      }
      piVar35 = (int *)(lVar14 + (ulong)uVar18);
      *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar32;
      if ((uVar18 + 0xffff < uVar32) || (*piVar35 != (int)*puVar38)) goto LAB_0010e937;
      puVar28 = (ulong *)((long)hashTable_16 + 1);
      *(char *)hashTable_16 = '\0';
      iVar6 = uVar32 - uVar18;
      pUVar21 = hashTable_16;
      puVar27 = puVar38;
    } while( true );
  }
  goto LAB_00110cd9;
code_r0x0010ec54:
  puVar24 = puVar24 + 1;
  puVar23 = puVar23 + 1;
  iVar6 = iVar6 + 8;
  goto LAB_0010ec40;
code_r0x0010ed15:
  puVar38 = puVar38 + 1;
  puVar23 = puVar23 + 1;
  iVar6 = iVar6 + 8;
  goto LAB_0010ed01;
code_r0x0010ebe8:
  puVar23 = puVar23 + 1;
  puVar8 = puVar8 + 1;
  iVar6 = iVar6 + 8;
  goto LAB_0010ebd0;
LAB_0010fca4:
  uVar20 = (long)piVar2 - (long)puVar38;
  iVar37 = 0;
  if (pcVar30 < (char *)((long)hashTable_16 + (uVar20 + 0xf0) / 0xff + uVar20 + 1))
  goto LAB_00110cd9;
  if (uVar20 < 0xf) {
LAB_00110c95:
    *(char *)hashTable_16 = (char)uVar20 << 4;
    dest = (char *)hashTable_16;
  }
  else {
    *(char *)hashTable_16 = -0x10;
    for (uVar13 = uVar20 - 0xf; hashTable_16 = (U32 *)((long)hashTable_16 + 1), 0xfe < uVar13;
        uVar13 = uVar13 - 0xff) {
      *(char *)hashTable_16 = -1;
    }
LAB_00110c9f:
    *(char *)hashTable_16 = (char)uVar13;
    dest = (char *)hashTable_16;
  }
LAB_00110cc9:
  memcpy((char *)((long)dest + 1),puVar38,uVar20);
  iVar37 = ((int)(char *)((long)dest + 1) + (int)uVar20) - local_88;
  goto LAB_00110cd9;
code_r0x0010f9f8:
  puVar24 = puVar24 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010f9e4;
code_r0x0010faad:
  puVar38 = puVar38 + 1;
  puVar23 = puVar23 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010fa99;
code_r0x0010f984:
  puVar23 = puVar23 + 1;
  puVar8 = puVar8 + 1;
  iVar12 = iVar12 + 8;
  goto LAB_0010f96c;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    if (streamPtr->dirty) { return 0; } /* Uninitialized structure detected */
    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                memcpy(streamPtr, streamPtr->dictCtx, sizeof(LZ4_stream_t));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}